

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O2

void ncnn::binary_op_broadcast<ncnn::binary_op_div>(Mat *a,Mat *b,Mat *c,Option *opt)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  void *pvVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  void *pvVar13;
  size_t sVar14;
  size_t sVar15;
  size_t sVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  float *pfVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  float *pfVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  int x_1;
  ulong uVar30;
  ulong uVar31;
  long lVar32;
  long lVar33;
  void *pvVar34;
  ulong uVar35;
  ulong uVar36;
  void *pvVar37;
  
  iVar1 = c->dims;
  uVar17 = c->h;
  uVar2 = c->w;
  uVar18 = c->d;
  uVar3 = c->c;
  if (iVar1 == 2) {
    pvVar9 = a->data;
    iVar4 = a->w;
    pvVar34 = b->data;
    iVar5 = b->w;
    pvVar37 = c->data;
    uVar31 = 0;
    uVar22 = 0;
    if (0 < (int)uVar2) {
      uVar22 = (ulong)uVar2;
    }
    uVar35 = 0;
    if (0 < (int)uVar17) {
      uVar35 = (ulong)uVar17;
    }
    sVar10 = c->elemsize;
    sVar11 = b->elemsize;
    uVar36 = (ulong)(b->h + -1);
    sVar12 = a->elemsize;
    uVar28 = (ulong)(a->h + -1);
    while( true ) {
      uVar30 = uVar36;
      if ((long)uVar31 < (long)uVar36) {
        uVar30 = uVar31;
      }
      uVar24 = uVar28;
      if ((long)uVar31 < (long)uVar28) {
        uVar24 = uVar31;
      }
      if (uVar31 == uVar35) break;
      pfVar20 = (float *)(uVar30 * (long)iVar5 * sVar11 + (long)pvVar34);
      pfVar26 = (float *)(uVar24 * (long)iVar4 * sVar12 + (long)pvVar9);
      for (uVar30 = 0; uVar22 != uVar30; uVar30 = uVar30 + 1) {
        *(float *)((long)pvVar37 + uVar30 * 4) = *pfVar26 / *pfVar20;
        pfVar20 = pfVar20 + (1 < (long)iVar5);
        pfVar26 = pfVar26 + (1 < (long)iVar4);
      }
      uVar31 = uVar31 + 1;
      pvVar37 = (void *)((long)pvVar37 + sVar10 * (long)(int)uVar2);
    }
  }
  else if (iVar1 == 1) {
    pfVar20 = (float *)a->data;
    pfVar26 = (float *)b->data;
    pvVar9 = c->data;
    iVar4 = a->w;
    iVar5 = b->w;
    uVar31 = 0;
    uVar22 = 0;
    if (0 < (int)uVar2) {
      uVar22 = (ulong)uVar2;
    }
    for (; uVar22 != uVar31; uVar31 = uVar31 + 1) {
      *(float *)((long)pvVar9 + uVar31 * 4) = *pfVar20 / *pfVar26;
      pfVar26 = pfVar26 + (1 < iVar5);
      pfVar20 = pfVar20 + (1 < iVar4);
    }
  }
  if (iVar1 - 3U < 2) {
    sVar10 = c->cstep;
    sVar11 = c->elemsize;
    iVar1 = a->w;
    iVar4 = b->w;
    uVar22 = 0;
    uVar31 = 0;
    if (0 < (int)uVar2) {
      uVar31 = (ulong)uVar2;
    }
    if ((int)uVar17 < 1) {
      uVar17 = 0;
    }
    if ((int)uVar18 < 1) {
      uVar18 = 0;
    }
    uVar35 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar35 = uVar22;
    }
    pvVar9 = c->data;
    for (; uVar22 != uVar35; uVar22 = uVar22 + 1) {
      pvVar34 = (void *)(sVar10 * sVar11 * uVar22 + (long)pvVar9);
      for (lVar27 = 0; (uint)lVar27 != uVar18; lVar27 = lVar27 + 1) {
        iVar5 = a->w;
        iVar6 = a->h;
        pvVar37 = a->data;
        sVar12 = a->elemsize;
        iVar7 = b->w;
        iVar8 = b->h;
        pvVar13 = b->data;
        sVar14 = b->elemsize;
        uVar28 = (ulong)(a->c + -1);
        if ((long)uVar22 < (long)uVar28) {
          uVar28 = uVar22;
        }
        sVar15 = a->cstep;
        lVar29 = (long)(a->d + -1);
        if (lVar27 < lVar29) {
          lVar29 = lVar27;
        }
        uVar36 = (ulong)(b->c + -1);
        if ((long)uVar22 < (long)uVar36) {
          uVar36 = uVar22;
        }
        sVar16 = b->cstep;
        lVar21 = (long)(b->d + -1);
        if (lVar27 < lVar21) {
          lVar21 = lVar27;
        }
        lVar33 = (long)(iVar6 + -1);
        lVar23 = (long)(iVar8 + -1);
        lVar32 = 0;
        while( true ) {
          lVar19 = lVar33;
          if (lVar32 < lVar33) {
            lVar19 = lVar32;
          }
          lVar25 = lVar23;
          if (lVar32 < lVar23) {
            lVar25 = lVar32;
          }
          if ((uint)lVar32 == uVar17) break;
          pfVar20 = (float *)(((lVar19 + lVar29 * iVar6) * (long)iVar5 + uVar28 * sVar15) * sVar12 +
                             (long)pvVar37);
          pfVar26 = (float *)(((lVar25 + lVar21 * iVar8) * (long)iVar7 + uVar36 * sVar16) * sVar14 +
                             (long)pvVar13);
          for (uVar30 = 0; uVar31 != uVar30; uVar30 = uVar30 + 1) {
            *(float *)((long)pvVar34 + uVar30 * 4) = *pfVar20 / *pfVar26;
            pfVar20 = pfVar20 + (1 < iVar1);
            pfVar26 = pfVar26 + (1 < iVar4);
          }
          pvVar34 = (void *)((long)pvVar34 + (long)(int)uVar2 * 4);
          lVar32 = lVar32 + 1;
        }
      }
    }
  }
  return;
}

Assistant:

static void binary_op_broadcast(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    // general broadcast
    const Op op;

    const int dims = c.dims;
    const int w = c.w;
    const int h = c.h;
    const int d = c.d;
    const int channels = c.c;

    if (dims == 1)
    {
        const float* ptr = a;
        const float* ptr1 = b;
        float* outptr = c;

        const int ainc = a.w > 1 ? 1 : 0;
        const int binc = b.w > 1 ? 1 : 0;

        for (int x = 0; x < w; x++)
        {
            outptr[x] = op(*ptr, *ptr1);
            ptr += ainc;
            ptr1 += binc;
        }
    }

    if (dims == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int y = 0; y < h; y++)
        {
            const float* ptr = a.row(std::min(y, a.h - 1));
            const float* ptr1 = b.row(std::min(y, b.h - 1));
            float* outptr = c.row(y);

            const int ainc = a.w > 1 ? 1 : 0;
            const int binc = b.w > 1 ? 1 : 0;

            for (int x = 0; x < w; x++)
            {
                outptr[x] = op(*ptr, *ptr1);
                ptr += ainc;
                ptr1 += binc;
            }
        }
    }

    if (dims == 3 || dims == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* outptr = c.channel(q);

            const int ainc = a.w > 1 ? 1 : 0;
            const int binc = b.w > 1 ? 1 : 0;

            for (int z = 0; z < d; z++)
            {
                for (int y = 0; y < h; y++)
                {
                    const float* ptr = a.channel(std::min(q, a.c - 1)).depth(std::min(z, a.d - 1)).row(std::min(y, a.h - 1));
                    const float* ptr1 = b.channel(std::min(q, b.c - 1)).depth(std::min(z, b.d - 1)).row(std::min(y, b.h - 1));

                    for (int x = 0; x < w; x++)
                    {
                        outptr[x] = op(*ptr, *ptr1);
                        ptr += ainc;
                        ptr1 += binc;
                    }

                    outptr += w;
                }
            }
        }
    }
}